

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

int64_t PhPacker::__phpack__detail::php_unpack_impl(char *data,int size,bool issigned,int *map)

{
  int iVar1;
  int local_34;
  int i;
  char *cresult;
  int64_t result;
  int *map_local;
  bool issigned_local;
  char *pcStack_10;
  int size_local;
  char *data_local;
  
  iVar1 = 0;
  if (issigned) {
    iVar1 = -1;
  }
  pcStack_10 = data;
  for (local_34 = 0; local_34 < size; local_34 = local_34 + 1) {
    *(char *)((long)&cresult + (long)map[local_34]) = *pcStack_10;
    pcStack_10 = pcStack_10 + 1;
  }
  return (long)iVar1;
}

Assistant:

int64_t php_unpack_impl(const char* data, int size, bool issigned, int* map) noexcept
{
    int64_t result {};
    char* cresult = reinterpret_cast<char*>(&result);

    result = issigned ? -1 : 0;

    for (int i = 0; i < size; ++i) {
        cresult[map[i]] = *data++;
    }
    return result;
}